

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadLane<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  unsigned_long *puVar2;
  unsigned_long local_38;
  T val;
  Simd<unsigned_long,_(unsigned_char)__x02_> result;
  Ptr *out_trap_local;
  Thread *this_local;
  
  result.v[1] = (unsigned_long)out_trap;
  _val = Pop<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this);
  RVar1 = Load<unsigned_long>(this,instr,&local_38,(Ptr *)result.v[1]);
  if (RVar1 == Ok) {
    puVar2 = Simd<unsigned_long,_(unsigned_char)'\x02'>::operator[]
                       ((Simd<unsigned_long,_(unsigned_char)__x02_> *)&val,
                        instr.field_2.imm_u32x2_u8.idx);
    *puVar2 = local_38;
    Push<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>(this,_val);
    this_local._4_4_ = Ok;
  }
  else {
    this_local._4_4_ = Trap;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoSimdLoadLane(Instr instr, Trap::Ptr* out_trap) {
  using T = typename S::LaneType;
  auto result = Pop<S>();
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  result[instr.imm_u32x2_u8.idx] = val;
  Push(result);
  return RunResult::Ok;
}